

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_copy_from(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t idx;
  uint uVar7;
  uint idx_00;
  bool bVar8;
  uint local_68;
  vm_val_t src_val;
  vm_val_t val;
  
  if ((getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    getp_copy_from::desc.min_argc_ = 4;
    getp_copy_from::desc.opt_argc_ = 0;
    getp_copy_from::desc.varargs_ = 0;
    __cxa_guard_release(&getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_copy_from::desc);
  if (iVar2 != 0) {
    return 1;
  }
  src_val.typ = sp_[-1].typ;
  src_val._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  src_val.val = sp_[-1].val;
  sp_ = sp_ + -1;
  iVar2 = vm_val_t::is_listlike(&src_val);
  if ((iVar2 != 0) && (uVar3 = vm_val_t::ll_length(&src_val), -1 < (int)uVar3)) {
    iVar2 = CVmBif::pop_int_val();
    idx_00 = (iVar2 >> 0x1f & uVar3 + 1) + iVar2;
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    iVar2 = CVmBif::pop_int_val();
    uVar7 = (iVar2 >> 0x1f & uVar1 + 1) + iVar2;
    uVar4 = CVmBif::pop_int_val();
    if ((int)idx_00 < 2) {
      idx_00 = 1;
    }
    if ((int)uVar7 < 2) {
      uVar7 = 1;
    }
    uVar5 = uVar3 - (idx_00 - 1);
    if ((int)(idx_00 + uVar4 + -1) < (int)uVar3) {
      uVar5 = uVar4;
    }
    uVar6 = 0;
    if (uVar3 < idx_00) {
      uVar5 = 0;
    }
    uVar3 = (uVar5 + uVar7) - 1;
    local_68 = (uint)uVar1;
    if ((int)local_68 < (int)uVar3) {
      set_element_count_undo(this,self,(ulong)uVar3);
    }
    idx = (size_t)(uVar7 - 1);
    if (0 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
      vm_val_t::ll_index(&src_val,&val,idx_00);
      set_element_undo(this,self,idx,&val);
      idx_00 = idx_00 + 1;
      idx = idx + 1;
    }
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    return 1;
  }
  err_throw(0x900);
}

Assistant:

int CVmObjVector::getp_copy_from(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(4);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the source value */
    vm_val_t src_val;
    G_stk->pop(&src_val);

    /* make sure the source argument is list-like, and get its length */
    int src_cnt;
    if (!src_val.is_listlike(vmg0_)
        || (src_cnt = src_val.ll_length(vmg0_)) < 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the source starting index, adjusting negatives to count from end */
    int src_start = CVmBif::pop_int_val(vmg0_);
    if (src_start < 0)
        src_start += src_cnt + 1;

    /* note the destination length (i.e., my element count) */
    int dst_cnt = get_element_count();

    /* get the destination starting index, adjusting negative values */
    int dst_start = CVmBif::pop_int_val(vmg0_);
    if (dst_start < 0)
        dst_start += dst_cnt + 1;

    /* get the number of elements to copy */
    int copy_cnt = CVmBif::pop_int_val(vmg0_);

    /* if either starting index is below 1, force it to 1 */
    if (src_start < 1)
        src_start = 1;
    if (dst_start < 1)
        dst_start = 1;

    /* adjust the starting indices to 0-based values */
    --src_start;
    --dst_start;

    /* limit our copying to the remaining elements of the source */
    if (src_start >= src_cnt)
        copy_cnt = 0;
    else if (src_start + copy_cnt >= src_cnt)
        copy_cnt = src_cnt - src_start;

    /* expand the vector if necessary to make room for added elements */
    if (dst_start + copy_cnt > dst_cnt)
        set_element_count_undo(vmg_ self, dst_start + copy_cnt);

    /* set the list elements */
    for (int i = 0 ; i < copy_cnt ; ++i)
    {
        /* get the source element at this index */
        vm_val_t val;
        src_val.ll_index(vmg_ &val, i + src_start + 1);

        /* set my element at this index, recording undo for the change */
        set_element_undo(vmg_ self, i + dst_start, &val);
    }

    /* the return value is 'self' */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}